

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

bool __thiscall Reducer::tryToReplaceChild(Reducer *this,Expression **child,Expression *with)

{
  Expression *pEVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  ostream *poVar5;
  string local_50;
  
  if ((((this->deNan == true) && (with->_id == ConstId)) &&
      (cVar2 = wasm::Literal::isNaN(), cVar2 != '\0')) ||
     (pEVar1 = *child, (pEVar1->type).id != (with->type).id)) {
    return false;
  }
  uVar4 = this->decisionCounter + 1;
  this->decisionCounter = uVar4;
  if (1 < uVar4 % (ulong)(long)this->factor) {
    return false;
  }
  *child = with;
  bVar3 = writeAndTestReduction(this);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|      tryToReplaceChild succeeded (in ",0x27);
    getLocation_abi_cxx11_(&local_50,this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    noteReduction(this,1);
    return bVar3;
  }
  *child = pEVar1;
  return bVar3;
}

Assistant:

bool tryToReplaceChild(Expression*& child, Expression* with) {
    if (!isOkReplacement(with)) {
      return false;
    }
    if (child->type != with->type) {
      return false;
    }
    if (!shouldTryToReduce()) {
      return false;
    }
    auto* before = child;
    child = with;
    if (!writeAndTestReduction()) {
      child = before;
      return false;
    }
    std::cerr << "|      tryToReplaceChild succeeded (in " << getLocation()
              << ")\n";
    // std::cerr << "|      " << before << " => " << with << '\n';
    noteReduction();
    return true;
  }